

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint32_t mur(uint32_t a,uint32_t h)

{
  uint32_t uVar1;
  uint in_ESI;
  int in_EDI;
  
  uVar1 = ror32(in_EDI * -0x3361d2af,0x11);
  uVar1 = ror32(uVar1 * 0x1b873593 ^ in_ESI,0x13);
  return uVar1 * 5 + 0xe6546b64;
}

Assistant:

static inline uint32_t mur(uint32_t a, uint32_t h) {
  // Helper from Murmur3 for combining two 32-bit values.
  a *= c1;
  a = ror32(a, 17);
  a *= c2;
  h ^= a;
  h = ror32(h, 19);
  return h * 5 + 0xe6546b64;
}